

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O1

void __thiscall
TPZDohrSubstruct<std::complex<float>_>::Contribute_v2_local
          (TPZDohrSubstruct<std::complex<float>_> *this,
          TPZFMatrix<std::complex<float>_> *residual_local,
          TPZFMatrix<std::complex<float>_> *v2_local)

{
  _ComplexT _Var1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  complex<float> *pcVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  complex<float> value;
  ulong uVar12;
  complex<float> in_R9;
  size_t __n;
  long lVar13;
  ulong uVar14;
  float fVar15;
  undefined8 uVar16;
  float fVar18;
  _ComplexT _Var17;
  float fVar19;
  float fVar20;
  float fVar21;
  TPZFMatrix<std::complex<float>_> temp2;
  TPZFMatrix<std::complex<float>_> LocalWeightedResidual;
  TPZFMatrix<std::complex<float>_> zi;
  TPZFMatrix<std::complex<float>_> I_lambda;
  TPZFMatrix<std::complex<float>_> KWeightedResidual;
  TPZFMatrix<std::complex<float>_> CstarKW;
  TPZFMatrix<std::complex<float>_> Lambda_star;
  undefined **ppuVar22;
  int local_460;
  float local_458;
  float fStack_454;
  TPZFMatrix<std::complex<float>_> local_420;
  TPZFMatrix<std::complex<float>_> local_390;
  TPZFMatrix<std::complex<float>_> local_300;
  TPZFMatrix<std::complex<float>_> local_270;
  TPZFMatrix<std::complex<float>_> local_1e0;
  TPZFMatrix<std::complex<float>_> local_150;
  TPZFMatrix<std::complex<float>_> local_c0;
  
  uVar3 = (residual_local->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  iVar2 = this->fNEquations;
  iVar4 = (int)uVar3;
  lVar11 = (long)iVar4;
  local_390.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_390.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_390.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018459c8;
  local_390.fElem = (complex<float> *)0x0;
  local_390.fGiven = (complex<float> *)0x0;
  local_390.fSize = 0;
  local_390.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = (long)iVar2;
  local_390.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = lVar11;
  TPZVec<int>::TPZVec(&local_390.fPivot.super_TPZVec<int>,0);
  local_390.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_390.fPivot.super_TPZVec<int>.fStore = local_390.fPivot.fExtAlloc;
  local_390.fPivot.super_TPZVec<int>.fNElements = 0;
  local_390.fPivot.super_TPZVec<int>.fNAlloc = 0;
  ppuVar22 = &PTR__TPZVec_01842418;
  local_390.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01842418;
  local_390.fWork.fStore = (complex<float> *)0x0;
  local_390.fWork.fNElements = 0;
  local_390.fWork.fNAlloc = 0;
  uVar9 = iVar2 * lVar11;
  if (uVar9 != 0) {
    uVar14 = 0xffffffffffffffff;
    if (uVar9 < 0x2000000000000000) {
      uVar14 = uVar9 * 8;
    }
    pcVar5 = (complex<float> *)operator_new__(uVar14);
    memset(pcVar5,0,uVar9 * 8);
    local_390.fElem = pcVar5;
    if (0 < (long)uVar9) {
      lVar6 = 0;
      do {
        pcVar5[lVar6]._M_value = 0;
        lVar6 = lVar6 + 1;
      } while (uVar9 - lVar6 != 0);
    }
  }
  uVar9 = (this->fGlobalEqs).fNElements;
  local_460 = (int)uVar9;
  if (0 < iVar4) {
    lVar6 = 0;
    uVar14 = 0;
    do {
      if (0 < local_460) {
        uVar10 = 0;
        do {
          iVar2 = (this->fGlobalEqs).fStore[uVar10].first;
          lVar13 = (long)iVar2;
          if (((residual_local->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <=
               (long)uVar10) ||
             ((residual_local->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
              (long)uVar14)) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar7 = (residual_local->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                  lVar6;
          _Var1 = (this->fWeights).super_TPZVec<std::complex<float>_>.fStore[lVar13]._M_value;
          fVar15 = (float)_Var1;
          fVar20 = (float)(_Var1 >> 0x20);
          fVar19 = *(float *)((long)&residual_local->fElem[uVar10]._M_value + lVar7);
          fVar18 = *(float *)((long)&residual_local->fElem[uVar10]._M_value + lVar7 + 4);
          fVar21 = fVar19 * fVar15 - fVar20 * fVar18;
          fVar19 = fVar19 * fVar20 + fVar15 * fVar18;
          uVar16 = CONCAT44(fVar19,fVar21);
          if ((NAN(fVar21)) && (uVar16 = CONCAT44(fVar19,fVar21), NAN(fVar19))) {
            uVar16 = __mulsc3(fVar15,fVar20);
          }
          fStack_454 = (float)((ulong)uVar16 >> 0x20);
          local_458 = (float)uVar16;
          if (((iVar2 < 0) ||
              (local_390.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow <= lVar13))
             || (local_390.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol <=
                 (long)uVar14)) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_390.fElem
          [local_390.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow * uVar14 +
           lVar13]._M_value =
               CONCAT44(fStack_454 +
                        (float)(local_390.fElem
                                [local_390.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix
                                 .fRow * uVar14 + lVar13]._M_value >> 0x20),
                        local_458 +
                        (float)local_390.fElem
                               [local_390.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.
                                fRow * uVar14 + lVar13]._M_value);
          uVar10 = uVar10 + 1;
        } while ((uVar9 & 0x7fffffff) != uVar10);
      }
      uVar14 = uVar14 + 1;
      lVar6 = lVar6 + 8;
    } while (uVar14 != (uVar3 & 0x7fffffff));
  }
  lVar6 = (long)this->fNEquations;
  lVar13 = (this->fNullPivots).super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow +
           (this->fCoarseIndex).fNElements;
  uVar14 = (ulong)(int)lVar13;
  local_270.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_270.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_270.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018459c8;
  local_270.fElem = (complex<float> *)0x0;
  local_270.fGiven = (complex<float> *)0x0;
  local_270.fSize = 0;
  local_270.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = uVar14;
  local_270.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = lVar11;
  TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
  local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
  local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_270.fPivot.super_TPZVec<int>.fNElements = 0;
  local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_270.fWork.fStore = (complex<float> *)0x0;
  local_270.fWork.fNElements = 0;
  local_270.fWork.fNAlloc = 0;
  uVar10 = uVar14 * lVar11;
  local_270.fWork._vptr_TPZVec = (_func_int **)ppuVar22;
  if (uVar10 != 0) {
    uVar8 = 0xffffffffffffffff;
    if (uVar10 < 0x2000000000000000) {
      uVar8 = uVar10 * 8;
    }
    pcVar5 = (complex<float> *)operator_new__(uVar8);
    memset(pcVar5,0,uVar10 * 8);
    local_270.fElem = pcVar5;
  }
  memset(local_270.fElem,0,
         local_270.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow *
         local_270.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol * 8);
  local_270.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix._24_2_ =
       local_270.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix._24_2_ & 0xff00;
  local_1e0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018459c8;
  local_1e0.fElem = (complex<float> *)0x0;
  local_1e0.fGiven = (complex<float> *)0x0;
  local_1e0.fSize = 0;
  local_1e0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = lVar6;
  local_1e0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = lVar11;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork.fStore = (complex<float> *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  uVar8 = lVar11 * lVar6;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)ppuVar22;
  if (uVar8 != 0) {
    uVar12 = 0xffffffffffffffff;
    if (uVar8 < 0x2000000000000000) {
      uVar12 = uVar8 * 8;
    }
    pcVar5 = (complex<float> *)operator_new__(uVar12);
    memset(pcVar5,0,uVar8 * 8);
    local_1e0.fElem = pcVar5;
  }
  TPZStepSolver<std::complex<float>_>::Solve
            (&this->fInvertedStiffness,&local_390,&local_1e0,(TPZFMatrix<std::complex<float>_> *)0x0
            );
  local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = 1;
  local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018459c8;
  local_c0.fElem = (complex<float> *)0x0;
  local_c0.fGiven = (complex<float> *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = uVar14;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  lVar13 = lVar13 << 0x20;
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork.fStore = (complex<float> *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)ppuVar22;
  if (lVar13 != 0) {
    __n = lVar13 >> 0x1d;
    uVar12 = 0xffffffffffffffff;
    if (uVar14 < 0x2000000000000000) {
      uVar12 = __n;
    }
    pcVar5 = (complex<float> *)operator_new__(uVar12);
    memset(pcVar5,0,__n);
    local_c0.fElem = pcVar5;
  }
  local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018459c8;
  local_150.fElem = (complex<float> *)0x0;
  local_150.fGiven = (complex<float> *)0x0;
  local_150.fSize = 0;
  local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = uVar14;
  local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = lVar11;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork.fStore = (complex<float> *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)ppuVar22;
  if (uVar10 != 0) {
    uVar12 = 0xffffffffffffffff;
    if (uVar10 < 0x2000000000000000) {
      uVar12 = uVar10 * 8;
    }
    pcVar5 = (complex<float> *)operator_new__(uVar12);
    memset(pcVar5,0,uVar10 * 8);
    local_150.fElem = pcVar5;
  }
  TPZFMatrix<std::complex<float>_>::MultAdd
            (&this->fC_star,&local_1e0,&local_1e0,&local_150,(complex<float>)0x0,in_R9,(int)ppuVar22
            );
  local_420.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_420.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_420.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018459c8;
  local_420.fElem = (complex<float> *)0x0;
  local_420.fGiven = (complex<float> *)0x0;
  local_420.fSize = 0;
  local_420.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = uVar14;
  local_420.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = lVar11;
  TPZVec<int>::TPZVec(&local_420.fPivot.super_TPZVec<int>,0);
  local_420.fPivot.super_TPZVec<int>.fStore = local_420.fPivot.fExtAlloc;
  local_420.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_420.fPivot.super_TPZVec<int>.fNElements = 0;
  local_420.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_420.fWork.fStore = (complex<float> *)0x0;
  local_420.fWork.fNElements = 0;
  local_420.fWork.fNAlloc = 0;
  local_420.fWork._vptr_TPZVec = (_func_int **)ppuVar22;
  if (uVar10 != 0) {
    uVar14 = 0xffffffffffffffff;
    if (uVar10 < 0x2000000000000000) {
      uVar14 = uVar10 * 8;
    }
    pcVar5 = (complex<float> *)operator_new__(uVar14);
    memset(pcVar5,0,uVar10 * 8);
    local_420.fElem = pcVar5;
  }
  TPZMatrix<std::complex<float>_>::Add
            (&local_270.super_TPZMatrix<std::complex<float>_>,
             &local_150.super_TPZMatrix<std::complex<float>_>,
             &local_420.super_TPZMatrix<std::complex<float>_>);
  TPZStepSolver<std::complex<float>_>::Solve
            (&this->finv,&local_420,&local_c0,(TPZFMatrix<std::complex<float>_> *)0x0);
  local_300.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_300.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_300.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018459c8;
  local_300.fElem = (complex<float> *)0x0;
  local_300.fGiven = (complex<float> *)0x0;
  local_300.fSize = 0;
  local_300.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = lVar6;
  local_300.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = lVar11;
  TPZVec<int>::TPZVec(&local_300.fPivot.super_TPZVec<int>,0);
  local_300.fPivot.super_TPZVec<int>.fStore = local_300.fPivot.fExtAlloc;
  local_300.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_300.fPivot.super_TPZVec<int>.fNElements = 0;
  local_300.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_300.fWork.fStore = (complex<float> *)0x0;
  local_300.fWork.fNElements = 0;
  local_300.fWork.fNAlloc = 0;
  local_300.fWork._vptr_TPZVec = (_func_int **)ppuVar22;
  if (uVar8 != 0) {
    uVar14 = 0xffffffffffffffff;
    if (uVar8 < 0x2000000000000000) {
      uVar14 = uVar8 * 8;
    }
    pcVar5 = (complex<float> *)operator_new__(uVar14);
    memset(pcVar5,0,uVar8 * 8);
    local_300.fElem = pcVar5;
  }
  TPZFMatrix<std::complex<float>_>::Resize(&local_420,lVar6,lVar11);
  value._M_value = (_ComplexT)&local_c0;
  TPZMatrix<std::complex<float>_>::Multiply
            (&(this->fKeC_star).super_TPZMatrix<std::complex<float>_>,
             (TPZFMatrix<std::complex<float>_> *)value._M_value,&local_420,0);
  TPZFMatrix<std::complex<float>_>::operator*=(&local_420,value);
  TPZMatrix<std::complex<float>_>::Add
            (&local_420.super_TPZMatrix<std::complex<float>_>,
             &local_1e0.super_TPZMatrix<std::complex<float>_>,
             &local_300.super_TPZMatrix<std::complex<float>_>);
  (*(v2_local->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xd])(v2_local,(long)local_460,lVar11);
  if (0 < iVar4) {
    lVar11 = 0;
    uVar14 = 0;
    do {
      if (0 < local_460) {
        uVar10 = 0;
        do {
          lVar6 = (long)(this->fGlobalEqs).fStore[uVar10].first;
          if (((lVar6 < 0) ||
              (local_300.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow <= lVar6))
             || (local_300.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol <=
                 (long)uVar14)) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          _Var1 = (this->fWeights).super_TPZVec<std::complex<float>_>.fStore[lVar6]._M_value;
          fVar19 = (float)_Var1;
          fVar18 = (float)(_Var1 >> 0x20);
          _Var1 = local_300.fElem
                  [local_300.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow * uVar14
                   + lVar6]._M_value;
          fVar15 = (float)(_Var1 >> 0x20);
          fVar21 = (float)_Var1 * fVar19 - fVar15 * fVar18;
          fVar20 = fVar19 * fVar15 + fVar18 * (float)_Var1;
          _Var17 = CONCAT44(fVar20,fVar21);
          if ((NAN(fVar21)) && (_Var17 = CONCAT44(fVar20,fVar21), NAN(fVar20))) {
            _Var17 = __mulsc3(fVar19,fVar18,_Var1,fVar15);
          }
          if (((v2_local->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <=
               (long)uVar10) ||
             ((v2_local->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
              (long)uVar14)) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          *(_ComplexT *)
           ((long)&v2_local->fElem[uVar10]._M_value +
           (v2_local->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * lVar11) =
               _Var17;
          uVar10 = uVar10 + 1;
        } while ((uVar9 & 0x7fffffff) != uVar10);
      }
      uVar14 = uVar14 + 1;
      lVar11 = lVar11 + 8;
    } while (uVar14 != (uVar3 & 0x7fffffff));
  }
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_300);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_420);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_150);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_c0);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_1e0);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_270);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_390);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::Contribute_v2_local(TPZFMatrix<TVar> &residual_local, TPZFMatrix<TVar> &v2_local)
{
    int ncols = residual_local.Cols();
	TPZFMatrix<TVar> LocalWeightedResidual(fNEquations,ncols,0.);
	int neqs = fGlobalEqs.NElements();
	int i;
    for (int ic=0; ic<ncols; ic++) 
    {
        for (i=0;i<neqs;i++) 
        {
            std::pair<int,int> ind = fGlobalEqs[i];
            LocalWeightedResidual(ind.first,ic) += fWeights[ind.first] * residual_local(i,ic);
        }
    }
	int ncoarse = fCoarseIndex.NElements();
	// size of the kernel
	int nnull = fNullPivots.Rows();
	// number of global indices
	int nglob = fNEquations;
	/** Solving the system for zi */
	//Constructing I star is the same I star for Phi
	//C star is the same C star for Phi
	//Constructing I_lambda
	TPZFMatrix<TVar> I_lambda(ncoarse+nnull,ncols);
	I_lambda.Zero();
	//K_star_inv*C_star_trans is the same used for Phi
	/* Computing K_star_inv*W(i)*R(i)*r = K_star_inv*fLocalWeightedResidual */
	TPZFMatrix<TVar> KWeightedResidual(nglob,ncols);
	fInvertedStiffness.Solve(LocalWeightedResidual,KWeightedResidual);
	//Obtaining lambda_star
	TPZFMatrix<TVar> Lambda_star(ncoarse+nnull,1);
	TPZFMatrix<TVar> CstarKW(ncoarse+nnull,ncols);
	fC_star.MultAdd(KWeightedResidual,KWeightedResidual,CstarKW,-1,0,0);
	TPZFMatrix<TVar> temp2(ncoarse+nnull,ncols);
	I_lambda.Add(CstarKW,temp2);
	finv.Solve(temp2, Lambda_star);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		Lambda_star.Print("Lambda_star ",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	//Obtaining z(i)
	TPZFMatrix<TVar> zi(nglob,ncols);
	temp2.Resize(nglob,ncols);
	fKeC_star.Multiply(Lambda_star,temp2);
	temp2 *= -1.;
	temp2.Add(KWeightedResidual,zi);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		zi.Print("zi ",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
#ifdef ZERO_INTERNAL_RESIDU
	for(i=0; i<fInternalEqs.NElements(); i++)
	{
		zi(fInternalEqs[i],0) = 0.;
	}
#endif
	v2_local.Resize(neqs, ncols);
    for (int ic=0; ic<ncols; ic++) 
    {
        for (i=0;i<neqs;i++) 
        {
            std::pair<int,int> ind = fGlobalEqs[i];
            v2_local(i,ic) = fWeights[ind.first] * zi(ind.first,ic);
        }
    }	
	
	
}